

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

FunctionPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::DataTypeSyntax*,slang::syntax::DeclaratorSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,DataTypeSyntax **args_5,
          DeclaratorSyntax *args_6)

{
  Token direction;
  Token constKeyword;
  Token staticKeyword;
  Token varKeyword;
  FunctionPortSyntax *pFVar1;
  undefined8 *in_RCX;
  Info *in_RDX;
  DataTypeSyntax *in_RSI;
  DeclaratorSyntax *in_RDI;
  Info *in_R8;
  long in_R9;
  size_t in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  BumpAllocator *in_stack_ffffffffffffff68;
  
  pFVar1 = (FunctionPortSyntax *)
           allocate(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  constKeyword.info = (Info *)in_RDX->rawTextPtr;
  constKeyword._0_8_ = in_RCX[1];
  direction.info = (Info *)*in_RCX;
  direction._0_8_ = in_R8->location;
  staticKeyword.info = in_R8;
  staticKeyword.kind = (short)in_R9;
  staticKeyword._2_1_ = (char)((ulong)in_R9 >> 0x10);
  staticKeyword.numFlags.raw = (char)((ulong)in_R9 >> 0x18);
  staticKeyword.rawLen = (int)((ulong)in_R9 >> 0x20);
  varKeyword.info = in_RDX;
  varKeyword._0_8_ = in_RCX;
  slang::syntax::FunctionPortSyntax::FunctionPortSyntax
            ((FunctionPortSyntax *)in_R8->rawTextPtr,
             *(SyntaxList<slang::syntax::AttributeInstanceSyntax> **)(in_R9 + 8),constKeyword,
             direction,staticKeyword,varKeyword,in_RSI,in_RDI);
  return pFVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }